

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

vector<BitState,_std::allocator<BitState>_> *
HdlcSimulationDataGenerator::BytesVectorToBitsVector
          (vector<BitState,_std::allocator<BitState>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *v,U32 numberOfBits)

{
  pointer puVar1;
  iterator __position;
  pointer pBVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint unaff_R15D;
  bool bVar7;
  bool bVar8;
  BitState bit;
  BitState local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (numberOfBits != 0) {
    uVar4 = 0;
    bVar7 = true;
    uVar5 = 0x80;
    uVar6 = 1;
    local_38 = v;
    do {
      if (bVar7) {
        puVar1 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_38->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar4) {
          uVar3 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          pBVar2 = (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pBVar2 != (pointer)0x0) {
            operator_delete(pBVar2);
          }
          _Unwind_Resume(uVar3);
        }
        unaff_R15D = (uint)puVar1[uVar4];
        uVar4 = uVar4 + 1;
        uVar5 = 0x80;
      }
      local_3c = (BitState)((uVar5 & unaff_R15D & 0xff) != 0);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,std::allocator<BitState>>::_M_realloc_insert<BitState_const&>
                  ((vector<BitState,std::allocator<BitState>> *)__return_storage_ptr__,__position,
                   &local_3c);
      }
      else {
        *__position._M_current = local_3c;
        (__return_storage_ptr__->super__Vector_base<BitState,_std::allocator<BitState>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar5 = uVar5 >> 1;
      bVar7 = (uVar6 & 7) == 0;
      bVar8 = uVar6 != numberOfBits;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<BitState> HdlcSimulationDataGenerator::BytesVectorToBitsVector( const vector<U8>& v, U32 numberOfBits )
{
    vector<BitState> bitsRet;
    U32 vectorIndex = 0;
    U8 byte;
    bool getByte = true;
    U8 bytePos = 0x80;
    for( U32 i = 0; i < numberOfBits; ++i )
    {
        if( getByte )
        {
            byte = v.at( vectorIndex );
            bytePos = 0x80;
            vectorIndex++;
        }

        BitState bit = ( byte & bytePos ) ? BIT_HIGH : BIT_LOW;
        bitsRet.push_back( bit );

        bytePos >>= 1;

        getByte = ( ( i + 1 ) % 8 == 0 );
    }

    return bitsRet;
}